

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_subset(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  size_t sVar3;
  vm_val_t *in_RDX;
  uint in_ESI;
  vm_rcdesc *in_RDI;
  vm_val_t *val;
  vm_val_t ele;
  vm_rcdesc rc;
  CVmObjVector *new_vec;
  size_t cnt;
  size_t dst;
  size_t src;
  vm_val_t *func_val;
  CVmNativeCodeDesc *in_stack_ffffffffffffff28;
  vm_val_t *this_00;
  undefined4 in_stack_ffffffffffffff30;
  vm_val_t *in_stack_ffffffffffffff40;
  uint argc_00;
  vm_val_t *in_stack_ffffffffffffff48;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff50;
  vm_val_t *in_stack_ffffffffffffff58;
  unsigned_short in_stack_ffffffffffffff62;
  vm_obj_id_t in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  vm_rcdesc *in_stack_ffffffffffffff70;
  ulong local_38;
  
  if ((getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_subset::desc,1);
    __cxa_guard_release(&getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             in_stack_ffffffffffffff62,in_stack_ffffffffffffff58,
             (uint *)in_stack_ffffffffffffff50.ptr);
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_RDI,(uint *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
  vVar2 = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (iVar1 == 0) {
    CVmStack::get(0);
    CVmRun::push_obj((CVmRun *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),vVar2);
    sVar3 = get_element_count((CVmObjVector *)0x34b666);
    this_00 = in_RDX;
    vVar2 = create(in_ESI,(size_t)in_RDX);
    vm_val_t::set_obj(this_00,vVar2);
    vm_objp(0);
    CVmStack::push(in_RDX);
    for (local_38 = 0; argc_00 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20), local_38 < sVar3;
        local_38 = local_38 + 1) {
      get_element((CVmObjVector *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),(size_t)this_00,
                  (vm_val_t *)0x34b6fe);
      CVmStack::push((vm_val_t *)&stack0xffffffffffffff48);
      CVmRun::call_func_ptr
                ((CVmRun *)in_stack_ffffffffffffff50.native_desc,in_stack_ffffffffffffff48,argc_00,
                 in_RDI,in_ESI);
      in_stack_ffffffffffffff40 = CVmRun::get_r0();
      if ((in_stack_ffffffffffffff40->typ != VM_NIL) &&
         ((in_stack_ffffffffffffff40->typ != VM_INT || ((in_stack_ffffffffffffff40->val).obj != 0)))
         ) {
        set_element((CVmObjVector *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),(size_t)this_00,
                    (vm_val_t *)0x34b76e);
      }
    }
    set_element_count((CVmObjVector *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),(size_t)this_00);
    CVmStack::discard(3);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_subset(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *argc)
{
    const vm_val_t *func_val;
    size_t src;
    size_t dst;
    size_t cnt;
    CVmObjVector *new_vec;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.subset", self, 5, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate the new vector that we'll return - all we know at this
     *   point is that the new vector won't be larger than the current
     *   vector, so allocate at the current size 
     */
    cnt = get_element_count();
    retval->set_obj(create(vmg_ FALSE, cnt));

    /* get the return value as an vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  If the element passes, write it to the current
     *   output location in the list; otherwise, just skip it.
     *   
     *   Note that we're using the same list as source and destination,
     *   which is easy because the list will either shrink or stay the
     *   same - we'll never need to insert new elements.  
     */
    for (src = dst = 0 ; src < cnt ; ++src)
    {
        vm_val_t ele;
        const vm_val_t *val;

        /* get this element from the source vector */
        get_element(src, &ele);

        /* push the element as the callback's argument */
        G_stk->push(&ele);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* 
         *   if the callback returned non-nil and non-zero, include this
         *   element in the result 
         */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* 
             *   include this element in the result (there's no need to
             *   save undo, since the whole vector is new) 
             */
            new_vec->set_element(dst, &ele);

            /* advance the output index */
            ++dst;
        }
    }

    /* set the actual number of elements in the result */
    new_vec->set_element_count(dst);

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}